

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContextUtil.cpp
# Opt level: O0

void sglr::drawQuadWithVaoBuffers(Context *ctx,deUint32 program,Vec3 *p0,Vec3 *p1)

{
  uint uVar1;
  deBool dVar2;
  TestError *this;
  uint local_c8 [2];
  deUint32 ndxID;
  uint local_b8;
  uint local_b4;
  deUint32 bufIDs [2];
  deUint32 vaoID;
  deInt32 coordLoc;
  deInt32 posLoc;
  deUint16 indices [6];
  float coord [8];
  float position [16];
  float hz;
  Vec3 *p1_local;
  Vec3 *p0_local;
  deUint32 program_local;
  Context *ctx_local;
  
  tcu::Vector<float,_3>::z(p0);
  tcu::Vector<float,_3>::z(p1);
  coord[6] = tcu::Vector<float,_3>::x(p0);
  coord[7] = tcu::Vector<float,_3>::y(p0);
  tcu::Vector<float,_3>::z(p0);
  tcu::Vector<float,_3>::x(p0);
  tcu::Vector<float,_3>::y(p1);
  tcu::Vector<float,_3>::x(p1);
  tcu::Vector<float,_3>::y(p0);
  tcu::Vector<float,_3>::x(p1);
  tcu::Vector<float,_3>::y(p1);
  tcu::Vector<float,_3>::z(p1);
  indices[2] = 0;
  indices[3] = 0;
  indices[4] = 0;
  indices[5] = 0;
  coord[0] = 0.0;
  coord[1] = 1.0;
  coord[2] = 1.0;
  coord[3] = 0.0;
  coord[4] = 1.0;
  coord[5] = 1.0;
  _coordLoc = 0x2000200010000;
  indices[0] = 1;
  indices[1] = 3;
  uVar1 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)program,"a_position");
  bufIDs[1] = (*ctx->_vptr_Context[0x59])(ctx,(ulong)program,"a_coord");
  (*ctx->_vptr_Context[0x4c])(ctx,1,bufIDs);
  (*ctx->_vptr_Context[0x4b])(ctx,(ulong)bufIDs[0]);
  (*ctx->_vptr_Context[0x26])(ctx,2,&local_b8);
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)program);
  while( true ) {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) || ((int)uVar1 < 0)) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)local_b8);
      (*ctx->_vptr_Context[0x28])(ctx,0x8892,0x40,coord + 6,0x88e4);
      (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar1);
      (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar1,4,0x1406,0,0,0);
      (*ctx->_vptr_Context[0x25])(ctx,0x8892,0);
      if (-1 < (int)bufIDs[1]) {
        (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)local_b4);
        (*ctx->_vptr_Context[0x28])(ctx,0x8892,0x20,indices + 2,0x88e4);
        (*ctx->_vptr_Context[0x50])(ctx,(ulong)bufIDs[1]);
        (*ctx->_vptr_Context[0x4e])(ctx,(ulong)bufIDs[1],2,0x1406,0,0,0);
        (*ctx->_vptr_Context[0x25])(ctx,0x8892,0);
      }
      (*ctx->_vptr_Context[0x26])(ctx,1,local_c8);
      (*ctx->_vptr_Context[0x25])(ctx,0x8893,(ulong)local_c8[0]);
      (*ctx->_vptr_Context[0x28])(ctx,0x8893,0xc,&coordLoc,0x88e4);
      (*ctx->_vptr_Context[0x6a])(ctx,4,6,0x1403,0);
      (*ctx->_vptr_Context[0x25])(ctx,0x8893,0);
      (*ctx->_vptr_Context[0x27])(ctx,1,local_c8);
      (*ctx->_vptr_Context[0x27])(ctx,2,&local_b8);
      (*ctx->_vptr_Context[0x4d])(ctx,1,bufIDs);
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrContextUtil.cpp"
             ,0x4b);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void drawQuadWithVaoBuffers (sglr::Context& ctx, deUint32 program, const tcu::Vec3& p0, const tcu::Vec3& p1)
{
	// Vertex data.
	float hz = (p0.z() + p1.z()) * 0.5f;
	float position[] =
	{
		p0.x(), p0.y(), p0.z(),	1.0f,
		p0.x(), p1.y(), hz,		1.0f,
		p1.x(), p0.y(), hz,		1.0f,
		p1.x(), p1.y(), p1.z(),	1.0f
	};
	const float coord[] =
	{
		0.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 0.0f,
		1.0f, 1.0f
	};
	const deUint16		indices[]	= { 0, 1, 2, 2, 1, 3 };

	deInt32				posLoc		= ctx.getAttribLocation(program, "a_position");
	deInt32				coordLoc	= ctx.getAttribLocation(program, "a_coord");
	deUint32			vaoID;
	deUint32			bufIDs[2];

	ctx.genVertexArrays(1, &vaoID);
	ctx.bindVertexArray(vaoID);

	ctx.genBuffers(2, &bufIDs[0]);

	ctx.useProgram(program);
	TCU_CHECK(posLoc >= 0);
	{
		ctx.bindBuffer(GL_ARRAY_BUFFER, bufIDs[0]);
		ctx.bufferData(GL_ARRAY_BUFFER, DE_LENGTH_OF_ARRAY(position)*sizeof(float), &position[0], GL_STATIC_DRAW);

		ctx.enableVertexAttribArray(posLoc);
		ctx.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);

		ctx.bindBuffer(GL_ARRAY_BUFFER, 0);
	}

	if (coordLoc >= 0)
	{
		ctx.bindBuffer(GL_ARRAY_BUFFER, bufIDs[1]);
		ctx.bufferData(GL_ARRAY_BUFFER, DE_LENGTH_OF_ARRAY(coord)*sizeof(float), &coord[0], GL_STATIC_DRAW);

		ctx.enableVertexAttribArray(coordLoc);
		ctx.vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, 0);

		ctx.bindBuffer(GL_ARRAY_BUFFER, 0);
	}

	{
		deUint32 ndxID;
		ctx.genBuffers(1, &ndxID);

		ctx.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, ndxID);
		ctx.bufferData(GL_ELEMENT_ARRAY_BUFFER, DE_LENGTH_OF_ARRAY(indices)*sizeof(deUint16), &indices[0], GL_STATIC_DRAW);

		ctx.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, 0);

		ctx.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		ctx.deleteBuffers(1, &ndxID);
	}

	ctx.deleteBuffers(2, &bufIDs[0]);
	ctx.deleteVertexArrays(1, &vaoID);
}